

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_8(QPDF *pdf,char *arg2)

{
  char cVar1;
  Provider *this;
  logic_error *this_00;
  QPDFWriter w;
  QPDFObjectHandle qstream;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p;
  shared_ptr<Buffer> b;
  QPDFObjectHandle root;
  Pl_Buffer p1;
  Pl_Flate p2;
  long *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  long local_128 [2];
  string local_118 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  Provider *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  Provider *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  shared_ptr<Buffer> local_e8;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined1 local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  string local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  long *local_98 [2];
  long local_88 [5];
  undefined1 local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  Pl_Flate local_50 [56];
  
  QPDF::getRoot();
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"/QStream","");
  QPDFObjectHandle::getKey(local_118);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  cVar1 = QPDFObjectHandle::isStream();
  if (cVar1 != '\0') {
    Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_98,"buffer",(Pipeline *)0x0);
    Pl_Flate::Pl_Flate(local_50,"compress",(Pipeline *)local_98,a_deflate,0x10000);
    Pipeline::operator<<((Pipeline *)local_50,"new data for stream\n");
    Pl_Flate::finish();
    Pl_Buffer::getBufferSharedPointer();
    this = (Provider *)operator_new(0x28);
    local_e8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
    local_e8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_d0;
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_d0->_M_use_count = local_d0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_d0->_M_use_count = local_d0->_M_use_count + 1;
      }
    }
    Provider::Provider(this,&local_e8);
    if (local_e8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    local_f8 = this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Provider*>(&local_f0,this);
    local_108 = local_f8;
    local_100 = local_f0._M_pi;
    if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
      }
    }
    local_138 = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"/FlateDecode","");
    QPDFObjectHandle::newName(local_b8);
    QPDFObjectHandle::newNull();
    QPDFObjectHandle::replaceStreamData(local_118,&local_108,local_b8,local_c8);
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    if (local_138 != local_128) {
      operator_delete(local_138,local_128[0] + 1);
    }
    if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
    }
    this->bad_length = false;
    QPDFWriter::QPDFWriter((QPDFWriter *)&local_138,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(&local_138,0));
    QPDFWriter::setLinearization(SUB81(&local_138,0));
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&local_138);
    QPDFWriter::write();
    this->bad_length = true;
    QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"oops -- getStreamData didn\'t throw",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
    }
    if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
    }
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    }
    Pl_Flate::~Pl_Flate(local_50);
    Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_98);
    if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"test 7 run on file with no QStream");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void
test_8(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle qstream = root.getKey("/QStream");
    if (!qstream.isStream()) {
        throw std::logic_error("test 7 run on file with no QStream");
    }
    Pl_Buffer p1("buffer");
    Pl_Flate p2("compress", &p1, Pl_Flate::a_deflate);
    p2 << "new data for stream\n";
    p2.finish();
    auto b = p1.getBufferSharedPointer();
    // This is a bogus way to use StreamDataProvider, but it does
    // adequately test its functionality.
    auto* provider = new Provider(b);
    auto p = std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(provider);
    qstream.replaceStreamData(
        p, QPDFObjectHandle::newName("/FlateDecode"), QPDFObjectHandle::newNull());
    provider->badLength(false);
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    // Linearize to force the provider to be called multiple times.
    w.setLinearization(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();

    // Every time a provider pipes stream data, it has to provide
    // the same amount of data.
    provider->badLength(true);
    try {
        qstream.getStreamData();
        std::cout << "oops -- getStreamData didn't throw" << std::endl;
    } catch (std::exception const& e) {
        std::cout << "exception: " << e.what() << std::endl;
    }
}